

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void normalize_suite::normalize_decreasing(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  allocator_type local_f1;
  vector<int,_std::allocator<int>_> local_f0;
  circular_view<int,_18446744073709551615UL> local_d8;
  int local_b8 [7];
  int local_9c [3];
  circular_view<int,_18446744073709551615UL> *local_90;
  size_type sStack_88;
  circular_view<int,_18446744073709551615UL> *local_80;
  size_type sStack_78;
  circular_view<int,_18446744073709551615UL> *local_70;
  size_type sStack_68;
  circular_view<int,_18446744073709551615UL> *local_60;
  size_type sStack_58;
  circular_view<int,_18446744073709551615UL> *local_50;
  size_type sStack_48;
  circular_view<int,_18446744073709551615UL> *local_40;
  size_type sStack_38;
  
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_d8.member.cap = 4;
  local_d8.member.size = 0;
  local_d8.member.next = 4;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_f0;
  local_d8.member.data = local_b8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_d8,1);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_d8.member.next - local_d8.member.size);
  }
  else {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_d8.member.next - local_d8.member.size) % uVar1);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_d8;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f0);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe04,"void normalize_suite::normalize_decreasing()",piVar2 != local_b8);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_d8);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_d8.member.next - local_d8.member.size);
  }
  else {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_d8.member.next - local_d8.member.size) % uVar1);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_d8;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f0);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe06,"void normalize_suite::normalize_decreasing()",piVar2 == local_b8);
  local_9c[0] = 0x16;
  local_9c[1] = 0x21;
  local_9c[2] = 0x2c;
  __l._M_len = 3;
  __l._M_array = local_9c;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar3 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar4 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_38 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_38 = local_d8.member.next % uVar1;
  }
  first_end.current = sStack_38;
  first_end.parent = &local_d8;
  first_begin.current = uVar4;
  first_begin.parent = &local_d8;
  local_40 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe0a,"void normalize_suite::normalize_decreasing()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uVar1 = local_d8.member.cap * 2;
  uVar3 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar4 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_48 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_48 = local_d8.member.next % uVar1;
  }
  first_end_00.current = sStack_48;
  first_end_00.parent = &local_d8;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_d8;
  local_50 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe0c,"void normalize_suite::normalize_decreasing()",first_begin_00,first_end_00,
             local_b8,local_b8 + local_d8.member.size);
  if ((view_pointer)
      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  input_00._M_len = 4;
  input_00._M_array = (iterator)&local_f0;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_d8,2);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_d8.member.next - local_d8.member.size);
  }
  else {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_d8.member.next - local_d8.member.size) % uVar1);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_d8;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f0);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe12,"void normalize_suite::normalize_decreasing()",piVar2 != local_b8);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_d8);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_d8.member.next - local_d8.member.size);
  }
  else {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_d8.member.next - local_d8.member.size) % uVar1);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_d8;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f0);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe14,"void normalize_suite::normalize_decreasing()",piVar2 == local_b8);
  local_9c[0] = 0x21;
  local_9c[1] = 0x2c;
  __l_00._M_len = 2;
  __l_00._M_array = local_9c;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_00,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar3 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar4 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_58 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_58 = local_d8.member.next % uVar1;
  }
  first_end_01.current = sStack_58;
  first_end_01.parent = &local_d8;
  first_begin_01.current = uVar4;
  first_begin_01.parent = &local_d8;
  local_60 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe18,"void normalize_suite::normalize_decreasing()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uVar1 = local_d8.member.cap * 2;
  uVar3 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar4 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_68 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_68 = local_d8.member.next % uVar1;
  }
  first_end_02.current = sStack_68;
  first_end_02.parent = &local_d8;
  first_begin_02.current = uVar4;
  first_begin_02.parent = &local_d8;
  local_70 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe1a,"void normalize_suite::normalize_decreasing()",first_begin_02,first_end_02,
             local_b8,local_b8 + local_d8.member.size);
  if ((view_pointer)
      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  input_01._M_len = 4;
  input_01._M_array = (iterator)&local_f0;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_d8,3);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_d8.member.next - local_d8.member.size);
  }
  else {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_d8.member.next - local_d8.member.size) % uVar1);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_d8;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f0);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe20,"void normalize_suite::normalize_decreasing()",piVar2 != local_b8);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_d8);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_d8.member.next - local_d8.member.size);
  }
  else {
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_d8.member.next - local_d8.member.size) % uVar1);
  }
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_d8;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f0);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe22,"void normalize_suite::normalize_decreasing()",piVar2 == local_b8);
  local_9c[0] = 0x2c;
  __l_01._M_len = 1;
  __l_01._M_array = local_9c;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_01,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar3 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar4 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_78 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_78 = local_d8.member.next % uVar1;
  }
  first_end_03.current = sStack_78;
  first_end_03.parent = &local_d8;
  first_begin_03.current = uVar4;
  first_begin_03.parent = &local_d8;
  local_80 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe26,"void normalize_suite::normalize_decreasing()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uVar1 = local_d8.member.cap * 2;
  uVar3 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar4 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_88 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_88 = local_d8.member.next % uVar1;
  }
  first_end_04.current = sStack_88;
  first_end_04.parent = &local_d8;
  first_begin_04.current = uVar4;
  first_begin_04.parent = &local_d8;
  local_90 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe28,"void normalize_suite::normalize_decreasing()",first_begin_04,first_end_04,
             local_b8,local_b8 + local_d8.member.size);
  if ((view_pointer)
      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void normalize_decreasing()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // X 22 33 44 => 22 33 44 X
        span = { 11, 22, 33, 44 };
        span.remove_front();
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X 33 44 => 33 44 X X
        span = { 11, 22, 33, 44 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X X 44 => 44 X X X
        span = { 11, 22, 33, 44 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}